

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O0

void CVmBifT3::get_named_arg(uint argc)

{
  int iVar1;
  char *pcVar2;
  vm_val_t *fp_00;
  vm_val_t *arg0;
  uchar *p;
  uint in_EDI;
  uint elen;
  uint eofs;
  int i;
  int n;
  uchar *t;
  vm_val_t *argp;
  vm_val_t *fp;
  size_t namelen;
  char *name;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  
  CVmBif::check_argc_range
            (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  CVmStack::get(0);
  pcVar2 = vm_val_t::get_as_string
                     ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pcVar2 == (char *)0x0) {
    err_throw(0);
  }
  fp_00 = (vm_val_t *)vmb_get_len((char *)0x2a21bd);
  arg0 = CVmRun::get_frame_ptr();
  do {
    if (arg0 == (vm_val_t *)0x0) {
      if (1 < in_EDI) {
        CVmStack::get(1);
        CVmBif::retval((vm_val_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        CVmStack::discard(in_EDI);
        return;
      }
      err_throw_a(0x89c,1,4,pcVar2 + 2,fp_00);
    }
    p = CVmRun::get_named_args_from_frame(fp_00,(vm_val_t **)arg0);
    if (p != (uchar *)0x0) {
      local_34 = ::osrp2(p);
      local_38 = 0;
      for (; -1 < local_34; local_34 = local_34 + -1) {
        in_stack_ffffffffffffffc4 = ::osrp2(p + (long)local_38 + 2);
        iVar1 = ::osrp2(p + (long)local_38 + 4);
        in_stack_ffffffffffffffc0 = iVar1 - in_stack_ffffffffffffffc4;
        if (((vm_val_t *)(ulong)in_stack_ffffffffffffffc0 == fp_00) &&
           (iVar1 = memcmp(pcVar2 + 2,p + (ulong)in_stack_ffffffffffffffc4 + 2,
                           (ulong)in_stack_ffffffffffffffc0), iVar1 == 0)) {
          CVmBif::retval((vm_val_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          CVmStack::discard(in_EDI);
          return;
        }
        local_38 = local_38 + 2;
      }
    }
    arg0 = CVmRun::get_enclosing_frame_ptr((vm_val_t *)0x2a22e6);
  } while( true );
}

Assistant:

void CVmBifT3::get_named_arg(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the name we're looking for */
    const char *name = G_stk->get(0)->get_as_string(vmg0_);
    if (name == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer pointer */
    size_t namelen = vmb_get_len(name);
    name += VMB_LEN;

    /* 
     *   Scan the stack for named parameter tables.  A named parameter table
     *   is always in the calling frame at the stack slot just beyond the
     *   last argument.  
     */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* check for a table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* scan the table for the name */
            for (int i = 0 ; n >= 0 ; --n, i += 2, ++argp)
            {
                /* get this element's offset, and figure its length */
                uint eofs = osrp2(t + i);
                uint elen = osrp2(t + i + 2) - eofs;

                /* check for a match */
                if (elen == namelen && memcmp(name, t + eofs, elen) == 0)
                {
                    /* found it - return the value */
                    retval(vmg_ argp);

                    /* discard arguments and return */
                    G_stk->discard(argc);
                    return;
                }
            }
        }
    }

    /* 
     *   The argument is undefined.  If a default value was supplied, simply
     *   return the default value.  Otherwise throw an error.  
     */
    if (argc >= 2)
    {
        /* a default value was supplied - simply return it */
        retval(vmg_ G_stk->get(1));

        /* discard arguments */
        G_stk->discard(argc);
    }
    else
    {
        /* no default value - throw an error */
        err_throw_a(VMERR_MISSING_NAMED_ARG, 1, ERR_TYPE_TEXTCHAR_LEN,
                    name, namelen);
    }
}